

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O0

void __thiscall b_tree::insert(b_tree *this,int64_t key,int64_t value)

{
  bool bVar1;
  int64_t *piVar2;
  bool bVar3;
  uint16_t uVar4;
  uint64_t uVar5;
  int64_t iVar6;
  undefined1 local_178 [8];
  b_tree_node new_root;
  b_tree_node copied_root;
  undefined1 local_98 [8];
  b_tree_node root;
  int64_t old_root_ofs;
  int attempt;
  bool inserted;
  int64_t value_local;
  int64_t key_local;
  b_tree *this_local;
  
  bVar1 = false;
  old_root_ofs._0_4_ = 0;
  while (!bVar1) {
    root._child_ofs_field = (int64_t *)pager::root_ofs(&this->_p);
    if (root._child_ofs_field == (int64_t *)0x0) {
      b_tree_node::b_tree_node((b_tree_node *)local_98,&this->_p,this->_min_degree,true);
      b_tree_node::_set_num_keys((b_tree_node *)local_98,1);
      b_tree_node::_set_key((b_tree_node *)local_98,0,key);
      b_tree_node::_set_valid_key((b_tree_node *)local_98,0,true);
      b_tree_node::_set_val((b_tree_node *)local_98,0,value);
      uVar5 = b_tree_node::_ofs((b_tree_node *)local_98);
      bVar3 = pager::set_root_ofs(&this->_p,0,uVar5);
      if (bVar3) {
        bVar1 = true;
      }
      else {
        printf("Failed to set root ofs 1 %d\n",(ulong)(uint)old_root_ofs);
        old_root_ofs._0_4_ = (uint)old_root_ofs + 1;
      }
      b_tree_node::~b_tree_node((b_tree_node *)local_98);
    }
    else {
      printf("Copied arm ofs: ");
      _copy_arm((b_tree_node *)&new_root._child_ofs_field,this,key,(int64_t)root._child_ofs_field);
      printf("\n");
      uVar4 = b_tree_node::_num_keys((b_tree_node *)&new_root._child_ofs_field);
      if ((uint)uVar4 == (uint)this->_min_degree * 2 - 1) {
        printf("Root is full\n");
        b_tree_node::b_tree_node((b_tree_node *)local_178,&this->_p,this->_min_degree,false);
        iVar6 = b_tree_node::_ofs((b_tree_node *)&new_root._child_ofs_field);
        b_tree_node::_set_child_ofs((b_tree_node *)local_178,0,iVar6);
        iVar6 = b_tree_node::_ofs((b_tree_node *)&new_root._child_ofs_field);
        b_tree_node::_split_child((b_tree_node *)local_178,0,iVar6);
        printf("insert ofs s: ");
        iVar6 = b_tree_node::_ofs((b_tree_node *)local_178);
        _insert_atomic_recursive(this,key,value,iVar6);
        printf("\n");
        piVar2 = root._child_ofs_field;
        uVar5 = b_tree_node::_ofs((b_tree_node *)local_178);
        bVar3 = pager::set_root_ofs(&this->_p,(uint64_t)piVar2,uVar5);
        if (bVar3) {
          bVar1 = true;
        }
        else {
          printf("Failed to set root ofs 2 %d\n",(ulong)(uint)old_root_ofs);
          old_root_ofs._0_4_ = (uint)old_root_ofs + 1;
        }
        b_tree_node::~b_tree_node((b_tree_node *)local_178);
      }
      else {
        printf("insert ofs: ");
        iVar6 = b_tree_node::_ofs((b_tree_node *)&new_root._child_ofs_field);
        _insert_atomic_recursive(this,key,value,iVar6);
        printf("\n");
        piVar2 = root._child_ofs_field;
        uVar5 = b_tree_node::_ofs((b_tree_node *)&new_root._child_ofs_field);
        bVar3 = pager::set_root_ofs(&this->_p,(uint64_t)piVar2,uVar5);
        if (bVar3) {
          bVar1 = true;
        }
        else {
          printf("Failed to set root ofs 3 %d\n",(ulong)(uint)old_root_ofs);
          old_root_ofs._0_4_ = (uint)old_root_ofs + 1;
        }
      }
      b_tree_node::~b_tree_node((b_tree_node *)&new_root._child_ofs_field);
    }
  }
  return;
}

Assistant:

void b_tree::insert(int64_t key, int64_t value) {
    bool inserted = false;
    int attempt = 0;
    while (!inserted) {
        int64_t old_root_ofs = _p.root_ofs();
        if (old_root_ofs == 0) {
            // If the tree is empty, create a new root node and insert the key-value pair
            b_tree_node root(_p, _min_degree, true);
            root._set_num_keys(1);
            root._set_key(0, key);
            root._set_valid_key(0, true);
            root._set_val(0, value);
            if(_p.set_root_ofs(0, root._ofs()))
                inserted = true;
            else { printf("Failed to set root ofs 1 %d\n",attempt); ++attempt; }
        } else {
            // Copy the arm of the tree from the root to the leaf node
            printf("Copied arm ofs: ");
            b_tree_node copied_root = _copy_arm(key, old_root_ofs);
            printf("\n");

            // Traverse down the copied arm and insert the key-value pair
            if (copied_root._num_keys() == 2 * _min_degree - 1) {
                printf("Root is full\n");
                // If the root node is full, split it preemptively
                b_tree_node new_root(_p, _min_degree, false);
                new_root._set_child_ofs(0, copied_root._ofs());
                new_root._split_child(0, copied_root._ofs());
                printf("insert ofs s: ");
                _insert_atomic_recursive(key, value, new_root._ofs());
                printf("\n");

                if(_p.set_root_ofs(old_root_ofs, new_root._ofs()))
                    inserted = true;
                else { printf("Failed to set root ofs 2 %d\n",attempt); ++attempt; }
            }
            else
            {
                printf("insert ofs: ");
                _insert_atomic_recursive(key, value, copied_root._ofs());
                printf("\n");
                if(_p.set_root_ofs(old_root_ofs, copied_root._ofs()))
                    inserted = true;
                else { printf("Failed to set root ofs 3 %d\n",attempt); ++attempt; }
            }
        }
    }
}